

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool BasePort::ParseOptions
               (char *arg,PortType *portType,int *portNum,string *IPaddr,bool *fwBridge,
               ostream *ostr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char *local_50 [4];
  
  if (arg == (char *)0x0) {
LAB_0010cfe9:
    poVar4 = std::operator<<(ostr,"ParseOptions: no option provided, using default ");
    DefaultPort_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)local_50);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)local_50);
    DefaultPort_abi_cxx11_();
    bVar2 = ParseOptions(local_50[0],portType,portNum,IPaddr,fwBridge,(ostream *)&std::cerr);
    std::__cxx11::string::~string((string *)local_50);
    return bVar2;
  }
  cVar1 = *arg;
  if (cVar1 == 'u') {
    if ((arg[1] == 'd') && (arg[2] == 'p')) {
      *portType = PORT_ETH_UDP;
      *fwBridge = false;
      if (arg[3] == 'f') {
        bVar2 = arg[4] == 'w';
        *fwBridge = bVar2;
        sVar5 = (ulong)bVar2 * 2 + 3;
      }
      else {
        sVar5 = 3;
        bVar2 = false;
      }
      sVar7 = strlen(arg);
      if (sVar7 == sVar5) {
        std::__cxx11::string::assign((char *)IPaddr);
        return true;
      }
      if (arg[sVar5] == ':') {
        sVar5 = strlen(arg + sVar5 + 1);
        if (7 < sVar5) {
          std::__cxx11::string::assign((char *)IPaddr);
          return true;
        }
        return true;
      }
      if (bVar2) {
        arg = "ParseOptions: missing \":\" after \"udpfw\"";
      }
      else {
        arg = "ParseOptions: missing \":\" after \"udp\"";
      }
      goto LAB_0010d21c;
    }
LAB_0010d13c:
    iVar3 = strncmp(arg,"emio",4);
    if (iVar3 == 0) {
      *portType = PORT_ZYNQ_EMIO;
      sVar5 = strlen(arg);
      if (sVar5 == 4) {
LAB_0010d1a5:
        *portNum = 0;
        return true;
      }
      if (arg[4] == ':') {
        iVar3 = __isoc99_sscanf(arg + 5,"%d",portNum);
        if (iVar3 == 1) {
          return true;
        }
        ostr = std::operator<<(ostr,"ParseOptions: failed to find a port number after \"emio:\" in "
                              );
        arg = arg + 3;
      }
      else {
        arg = "ParseOptions: missing \":\" after \"emio\"";
      }
      goto LAB_0010d21c;
    }
    *portType = PORT_FIREWIRE;
    iVar3 = __isoc99_sscanf(arg,"%d",portNum);
    if (iVar3 == 1) {
      return true;
    }
    pcVar8 = "ParseOptions: failed to find a FireWire port number in ";
  }
  else {
    if (cVar1 == 'e') {
      if ((arg[1] == 't') && (arg[2] == 'h')) {
        *portType = PORT_ETH_RAW;
        *fwBridge = false;
        if (arg[3] == 'f') {
          cVar1 = arg[4];
          *fwBridge = cVar1 == 'w';
          lVar6 = (ulong)(cVar1 == 'w') * 2 + 4;
        }
        else {
          lVar6 = 4;
        }
        iVar3 = __isoc99_sscanf(arg + lVar6,"%d",portNum);
        return iVar3 == 1;
      }
      goto LAB_0010d13c;
    }
    if (cVar1 != 'f') {
      if (cVar1 == '\0') goto LAB_0010cfe9;
      goto LAB_0010d13c;
    }
    if (arg[1] != 'w') goto LAB_0010d13c;
    *portType = PORT_FIREWIRE;
    sVar5 = strlen(arg);
    if (sVar5 == 2) goto LAB_0010d1a5;
    if (arg[2] != ':') {
      arg = "ParseOptions: missing \":\" after \"fw\"";
      goto LAB_0010d21c;
    }
    arg = arg + 3;
    iVar3 = __isoc99_sscanf(arg,"%d",portNum);
    if (iVar3 == 1) {
      return true;
    }
    pcVar8 = "ParseOptions: failed to find a port number after \"fw:\" in ";
  }
  ostr = std::operator<<(ostr,pcVar8);
LAB_0010d21c:
  poVar4 = std::operator<<(ostr,arg);
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool BasePort::ParseOptions(const char *arg, PortType &portType, int &portNum, std::string &IPaddr,
                            bool &fwBridge, std::ostream &ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseOptions: no option provided, using default "
             << DefaultPort() << std::endl;
        return ParseOptions(DefaultPort().c_str(), portType, portNum, IPaddr, fwBridge);
    }
    // expecting proper options
    if (strncmp(arg, "fw", 2) == 0) {
        portType = PORT_FIREWIRE;
        // no port specified
        if (strlen(arg) == 2) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[2] != ':') {
            ostr << "ParseOptions: missing \":\" after \"fw\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+3, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"fw:\" in " << arg+3 << std::endl;
        return false;
    }
    else if (strncmp(arg, "eth", 3) == 0) {
        portType = PORT_ETH_RAW;
        fwBridge = false;
        unsigned int numOffset = 4;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            numOffset += 2;
        }
        return (sscanf(arg+numOffset, "%d", &portNum) == 1);
    }
    else if (strncmp(arg, "udp", 3) == 0) {
        portType = PORT_ETH_UDP;
        fwBridge = false;
        unsigned int colonPos = 3;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            colonPos += 2;
        }
        // no option specified
        if (strlen(arg) == colonPos) {
            IPaddr = ETH_UDP_DEFAULT_IP;
            return true;
        }
        // make sure separator is here
        if (arg[colonPos] != ':') {
            if (colonPos == 3)
                ostr << "ParseOptions: missing \":\" after \"udp\"" << std::endl;
            else
                ostr << "ParseOptions: missing \":\" after \"udpfw\"" << std::endl;
            return false;
        }
        // For now, if at least 8 characters, assume a valid IP address
        if (strlen(arg+colonPos+1) >= 8)
            IPaddr.assign(arg+colonPos+1);
        return true;
    }
    else if (strncmp(arg, "emio", 4) == 0) {
        portType = PORT_ZYNQ_EMIO;
        // no port specified
        if (strlen(arg) == 4) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[4] != ':') {
            ostr << "ParseOptions: missing \":\" after \"emio\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+5, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"emio:\" in " << arg+3 << std::endl;
        return false;
    }
    // older default, fw and looking for port number
    portType = PORT_FIREWIRE;
    // scan port number
    if (sscanf(arg, "%d", &portNum) == 1) {
        return true;
    }
    ostr << "ParseOptions: failed to find a FireWire port number in " << arg << std::endl;
    return false;
}